

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O2

void __thiscall xray_re::way_path_io::operator()(way_path_io *this,way_path **_path,xr_reader *r)

{
  way_point_vec *this_00;
  ushort uVar1;
  uint16_t *puVar2;
  ushort *puVar3;
  size_t sVar4;
  uint uVar5;
  way_point *this_01;
  char *__assertion;
  uint16_t version;
  way_path *local_68;
  way_point local_60;
  
  local_68 = (way_path *)operator_new(0x50);
  (local_68->name)._M_dataplus._M_p = (pointer)&(local_68->name).field_2;
  (local_68->name)._M_string_length = 0;
  (local_68->name).field_2._M_local_buf[0] = '\0';
  (local_68->points).super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_68->points).super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_68->points).super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_68->links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_68->links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_68->links).super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *_path = local_68;
  sVar4 = xr_reader::r_chunk<unsigned_short>(r,1,&version);
  if (sVar4 == 0) {
    __assertion = "0";
    uVar5 = 0x3a;
  }
  else if ((version & 0xfffe) == 0x12) {
    sVar4 = xr_reader::find_chunk(r,2);
    if (sVar4 == 0) {
      __assertion = "0";
      uVar5 = 0x3e;
    }
    else {
      this_00 = &local_68->points;
      if (version == 0x12) {
        puVar3 = (r->field_2).m_p_u16;
        (r->field_2).m_p = (uint8_t *)(puVar3 + 1);
        uVar1 = *puVar3;
        std::vector<xray_re::way_point,_std::allocator<xray_re::way_point>_>::reserve
                  (this_00,(ulong)uVar1);
        for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
          local_60.position.field_0._0_8_ = 0;
          local_60._40_8_ = 0;
          local_60.name.field_2._M_allocated_capacity = 0;
          local_60.name.field_2._8_8_ = 0;
          local_60.name._M_string_length = 0;
          local_60.name._M_dataplus._M_p = (pointer)&local_60.name.field_2;
          std::vector<xray_re::way_point,_std::allocator<xray_re::way_point>_>::
          emplace_back<xray_re::way_point>(this_00,&local_60);
          this_01 = &local_60;
          std::__cxx11::string::~string((string *)&local_60);
          way_point_io_12::operator()
                    ((way_point_io_12 *)this_01,
                     (local_68->points).
                     super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1,r,uVar5);
        }
      }
      else {
        if (version != 0x13) {
          __assertion = "false";
          uVar5 = 0x4e;
          goto LAB_00183a1d;
        }
        puVar2 = (r->field_2).m_p_u16;
        (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
        xr_reader::
        r_seq<std::vector<xray_re::way_point,std::allocator<xray_re::way_point>>,xray_re::way_point_io>
                  (r,*puVar2,this_00);
      }
      sVar4 = xr_reader::find_chunk(r,3);
      if (sVar4 == 0) {
        __assertion = "0";
        uVar5 = 0x54;
      }
      else {
        if (version == 0x12) {
          puVar2 = (r->field_2).m_p_u16;
          (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
          xr_reader::
          r_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io_12>
                    (r,*puVar2,&local_68->links);
        }
        else {
          if (version != 0x13) {
            __assertion = "false";
            uVar5 = 0x5e;
            goto LAB_00183a1d;
          }
          puVar2 = (r->field_2).m_p_u16;
          (r->field_2).m_p = (uint8_t *)(puVar2 + 1);
          xr_reader::
          r_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io>
                    (r,*puVar2,&local_68->links);
        }
        sVar4 = xr_reader::find_chunk(r,5);
        if (sVar4 != 0) {
          xr_reader::r_sz(r,&local_68->name);
          return;
        }
        __assertion = "0";
        uVar5 = 100;
      }
    }
  }
  else {
    __assertion = "version == WAYOBJECT_VERSION || version == WAYOBJECT_VERSION_12";
    uVar5 = 0x3b;
  }
LAB_00183a1d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ai_way.cxx"
                ,uVar5,"void xray_re::way_path_io::operator()(way_path *&, xr_reader &) const");
}

Assistant:

void way_path_io::operator()(way_path*& _path, xr_reader& r) const
{
	way_path* path = new way_path;
	_path = path;
	uint16_t version;
	if (!r.r_chunk<uint16_t>(WAYOBJECT_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == WAYOBJECT_VERSION || version == WAYOBJECT_VERSION_12);

	if (!r.find_chunk(WAYOBJECT_CHUNK_POINTS))
		xr_not_expected();

	switch(version) {
	case WAYOBJECT_VERSION:
		r.r_seq(r.r_u16(), path->points, way_point_io());
		break;
	case WAYOBJECT_VERSION_12: {
		int n = r.r_u16();
		path->points.reserve(n);
		for (int i = 0; i != n; i++) {
			path->points.push_back(way_point());
			way_point_io_12()(path->points.back(), r, i);
		}
		}
		break;
	default:
		xr_assert(false);
	}

	r.debug_find_chunk();

	if (!r.find_chunk(WAYOBJECT_CHUNK_LINKS))
		xr_not_expected();

	switch(version) {
	case WAYOBJECT_VERSION:
		r.r_seq(r.r_u16(), path->links, way_link_io());
		break;
	case WAYOBJECT_VERSION_12:
		r.r_seq(r.r_u16(), path->links, way_link_io_12());
		break;
	default:
		xr_assert(false);
	}

	r.debug_find_chunk();

	if (!r.find_chunk(WAYOBJECT_CHUNK_NAME))
		xr_not_expected();
	r.r_sz(path->name);
	r.debug_find_chunk();
}